

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_material.cpp
# Opt level: O1

char * ParsePast(char *token,char *s)

{
  char cVar1;
  char cVar2;
  char cVar3;
  char *pcVar4;
  char *pcVar5;
  char cVar6;
  
  if ((token != (char *)0x0) && (' ' < *token)) {
    if (s != (char *)0x0) goto LAB_004dc3d1;
    pcVar4 = (char *)0x0;
    cVar2 = '\0';
    while ((s = pcVar4, cVar2 == ' ' || ((cVar2 != '\0' && ((byte)(cVar2 - 9U) < 5))))) {
LAB_004dc3d1:
      pcVar4 = s + 1;
      cVar2 = *s;
    }
    if ((pcVar4 != (char *)0x0) && (' ' < *pcVar4)) {
      cVar2 = *pcVar4;
      cVar3 = cVar2 + -0x20;
      if (0x19 < (byte)(cVar2 + 0x9fU)) {
        cVar3 = cVar2;
      }
      cVar1 = *token;
      cVar6 = cVar1 + -0x20;
      if (0x19 < (byte)(cVar1 + 0x9fU)) {
        cVar6 = cVar1;
      }
      if (cVar3 == cVar6) {
        pcVar5 = token + 1;
        do {
          if (cVar2 == '\0') {
            return pcVar4;
          }
          cVar2 = pcVar4[1];
          pcVar4 = pcVar4 + 1;
          cVar3 = cVar2 + -0x20;
          if (0x19 < (byte)(cVar2 + 0x9fU)) {
            cVar3 = cVar2;
          }
          cVar1 = *pcVar5;
          cVar6 = cVar1 + -0x20;
          if (0x19 < (byte)(cVar1 + 0x9fU)) {
            cVar6 = cVar1;
          }
          pcVar5 = pcVar5 + 1;
        } while (cVar3 == cVar6);
        return (char *)0x0;
      }
    }
  }
  return (char *)0x0;
}

Assistant:

static const char* ParsePast(const char* token, const char* s)
{
  if (0 == token || token[0] <= 32)
    return 0;

  s = ParsePastWhiteSpace(s);
  if (0 == s || s[0] <= 32)
    return 0;

  for (/*empty init*/; ToUpper(*s) == ToUpper(*token); s++, token++)
  {
    if (0 == *s)
      return s;
  }
  return 0;
}